

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::python::Generator::
PrintDescriptorOptionsFixingCode<google::protobuf::FieldDescriptor>
          (Generator *this,FieldDescriptor *descriptor,Proto *proto,string_view descriptor_str)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *__n_00;
  char *__s;
  size_type __n;
  string_view text;
  string_view serialized_options;
  string descriptor_name;
  string options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  AlphaNum local_128;
  string local_f8;
  undefined1 local_d8 [32];
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  __s = descriptor_str._M_str;
  __n_00 = (char *)descriptor_str._M_len;
  pcVar3 = __n_00;
  google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
  serialized_options._M_str = pcVar3;
  serialized_options._M_len = local_128.piece_._M_len;
  (anonymous_namespace)::OptionsValue_abi_cxx11_
            (&local_f8,(_anonymous_namespace_ *)local_128.piece_._M_str,serialized_options);
  if ((char *)local_128.piece_._M_len != local_128.digits_) {
    operator_delete((void *)local_128.piece_._M_len,local_128.digits_._0_8_ + 1);
  }
  local_58.piece_._M_len = (size_t)__n_00;
  local_58.piece_._M_str = __s;
  if ((__n_00 == (char *)0x0) || (pvVar2 = memchr(__s,0x2e,(size_t)__n_00), pvVar2 == (void *)0x0))
  {
LAB_00303df5:
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148.field_2._M_local_buf[0] = '\0';
    local_148._M_string_length = 0;
    local_128.piece_._M_len = 10;
    local_128.piece_._M_str = "_globals[\'";
    local_88.piece_._M_len = 2;
    local_88.piece_._M_str = "\']";
    absl::lts_20240722::StrCat_abi_cxx11_(&local_b8,&local_128,&local_58);
    std::__cxx11::string::operator=((string *)&local_148,(string *)&local_b8);
    local_d8._0_8_ = local_b8.piece_._M_len;
    if ((char *)local_b8.piece_._M_len == local_b8.digits_) goto LAB_00303e77;
  }
  else {
    pcVar3 = (char *)((long)pvVar2 - (long)__s);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    if (pcVar3 == (char *)0xffffffffffffffff) goto LAB_00303df5;
    local_128.piece_._M_len = 10;
    local_128.piece_._M_str = "_globals[\'";
    local_88.piece_._M_len = 2;
    local_88.piece_._M_str = "\']";
    local_b8.piece_._M_len = (size_t)(__n_00 + -(long)pcVar3);
    if (__n_00 < pcVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 pcVar3,__n_00);
    }
    local_b8.piece_._M_str = __s + (long)pcVar3;
    local_58.piece_._M_len = (size_t)pcVar3;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_d8,&local_128,&local_58,&local_88);
    std::__cxx11::string::operator=((string *)&local_148,(string *)local_d8);
    local_b8.digits_._0_8_ = local_d8._16_8_;
    if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) goto LAB_00303e77;
  }
  operator_delete((void *)local_d8._0_8_,local_b8.digits_._0_8_ + 1);
LAB_00303e77:
  iVar1 = std::__cxx11::string::compare((char *)&local_f8);
  if (iVar1 != 0) {
    text._M_str = 
    "$descriptor_name$._loaded_options = None\n$descriptor_name$._serialized_options = $serialized_value$\n"
    ;
    text._M_len = 100;
    io::Printer::Print<char[16],std::__cxx11::string,char[17],std::__cxx11::string>
              (this->printer_,text,(char (*) [16])0x469227,&local_148,
               (char (*) [17])"serialized_value",&local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return iVar1 != 0;
}

Assistant:

bool Generator::PrintDescriptorOptionsFixingCode(
    const DescriptorT& descriptor, const typename DescriptorT::Proto& proto,
    absl::string_view descriptor_str) const {
  std::string options = OptionsValue(proto.options().SerializeAsString());

  // Reset the _options to None thus DescriptorBase.GetOptions() can
  // parse _options again after extensions are registered.
  size_t dot_pos = descriptor_str.find('.');
  std::string descriptor_name;
  if (dot_pos == std::string::npos) {
    descriptor_name = absl::StrCat("_globals['", descriptor_str, "']");
  } else {
    descriptor_name =
        absl::StrCat("_globals['", descriptor_str.substr(0, dot_pos), "']",
                     descriptor_str.substr(dot_pos));
  }

  if (options == "None") {
    return false;
  }

  printer_->Print(
      "$descriptor_name$._loaded_options = None\n"
      "$descriptor_name$._serialized_options = $serialized_value$\n",
      "descriptor_name", descriptor_name, "serialized_value", options);
  return true;
}